

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesTestsUtil.cpp
# Opt level: O3

UVec3 vkt::sparse::getLayerSize(ImageType imageType,UVec3 *imageSize)

{
  uint uVar1;
  undefined8 *in_RDI;
  undefined8 uVar2;
  UVec3 UVar3;
  
  UVar3.m_data[2] = (uint)imageSize;
  uVar1 = 1;
  if (imageType < IMAGE_TYPE_LAST) {
    if ((0x6cU >> (imageType & 0x1f) & 1) == 0) {
      if ((0x83U >> (imageType & 0x1f) & 1) == 0) {
        uVar2 = *(undefined8 *)imageSize->m_data;
        uVar1 = imageSize->m_data[2];
      }
      else {
        uVar2 = CONCAT44(1,imageSize->m_data[0]);
      }
    }
    else {
      uVar2 = *(undefined8 *)imageSize->m_data;
    }
  }
  else {
    uVar2 = 0x100000001;
  }
  *in_RDI = uVar2;
  *(uint *)(in_RDI + 1) = uVar1;
  UVar3.m_data._0_8_ = in_RDI;
  return (UVec3)UVar3.m_data;
}

Assistant:

tcu::UVec3 getLayerSize (const ImageType imageType, const tcu::UVec3& imageSize)
{
	switch (imageType)
	{
	case IMAGE_TYPE_1D:
	case IMAGE_TYPE_1D_ARRAY:
	case IMAGE_TYPE_BUFFER:
		return tcu::UVec3(imageSize.x(), 1u, 1u);

	case IMAGE_TYPE_2D:
	case IMAGE_TYPE_2D_ARRAY:
	case IMAGE_TYPE_CUBE:
	case IMAGE_TYPE_CUBE_ARRAY:
		return tcu::UVec3(imageSize.x(), imageSize.y(), 1u);

	case IMAGE_TYPE_3D:
		return tcu::UVec3(imageSize.x(), imageSize.y(), imageSize.z());

	default:
		DE_FATAL("Unknown image type");
		return tcu::UVec3(1u, 1u, 1u);
	}
}